

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int message_get_message_annotations(MESSAGE_HANDLE message,annotations *message_annotations)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  int iVar3;
  
  if (message == (MESSAGE_HANDLE)0x0 || message_annotations == (annotations *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x2a9;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_message_annotations",0x2a8,1,
                "Bad arguments: message = %p, message_annotations = %p",message,message_annotations)
      ;
    }
  }
  else if (message->message_annotations == (AMQP_VALUE)0x0) {
    *message_annotations = (annotations)0x0;
    iVar3 = 0;
  }
  else {
    pAVar2 = amqpvalue_clone(message->message_annotations);
    *message_annotations = pAVar2;
    iVar3 = 0;
    if (pAVar2 == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      iVar3 = 0x2be;
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_get_message_annotations",0x2bd,1,"Cannot clone message annotations");
      }
    }
  }
  return iVar3;
}

Assistant:

int message_get_message_annotations(MESSAGE_HANDLE message, annotations* message_annotations)
{
    int result;

    if ((message == NULL) ||
        (message_annotations == NULL))
    {
        /* Codes_SRS_MESSAGE_01_049: [ If `message` or `annotations` is NULL, `message_get_message_annotations` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, message_annotations = %p",
            message, message_annotations);
        result = MU_FAILURE;
    }
    else
    {
        if (message->message_annotations == NULL)
        {
            /* Codes_SRS_MESSAGE_01_146: [ If no message annotations have been set, `message_get_message_annotations` shall set `annotations` to NULL. ]*/
            *message_annotations = NULL;

            /* Codes_SRS_MESSAGE_01_048: [ On success, `message_get_message_annotations` shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_047: [ `message_get_message_annotations` shall copy the contents of message annotations for the message instance identified by `message` into the argument `annotations`. ]*/
            /* Codes_SRS_MESSAGE_01_050: [ Cloning the message annotations shall be done by calling `annotations_clone`. ]*/
            *message_annotations = annotations_clone(message->message_annotations);
            if (*message_annotations == NULL)
            {
                /* Codes_SRS_MESSAGE_01_051: [ If `annotations_clone` fails, `message_get_message_annotations` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message annotations");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_048: [ On success, `message_get_message_annotations` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}